

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Module::mapInstruction(Module *this,Instruction *instruction)

{
  Id IVar1;
  size_type sVar2;
  reference ppIVar3;
  Id resultId;
  Instruction *instruction_local;
  Module *this_local;
  
  IVar1 = spv::Instruction::getResultId(instruction);
  sVar2 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size
                    (&this->idToInstruction);
  if (sVar2 <= IVar1) {
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::resize
              (&this->idToInstruction,(ulong)(IVar1 + 0x10));
  }
  ppIVar3 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                      (&this->idToInstruction,(ulong)IVar1);
  *ppIVar3 = instruction;
  return;
}

Assistant:

void mapInstruction(Instruction *instruction)
    {
        spv::Id resultId = instruction->getResultId();
        // map the instruction's result id
        if (resultId >= idToInstruction.size())
            idToInstruction.resize(resultId + 16);
        idToInstruction[resultId] = instruction;
    }